

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransportamqp_methods.c
# Opt level: O2

void iothubtransportamqp_methods_unsubscribe
               (IOTHUBTRANSPORT_AMQP_METHODS_HANDLE iothubtransport_amqp_methods_handle)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  int iVar1;
  char *pcVar2;
  
  if (iothubtransport_amqp_methods_handle == (IOTHUBTRANSPORT_AMQP_METHODS_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar2 = "NULL handle";
      iVar1 = 0x302;
LAB_0013d6eb:
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransportamqp_methods.c"
                 ,"iothubtransportamqp_methods_unsubscribe",iVar1,1,pcVar2);
      return;
    }
  }
  else if (iothubtransport_amqp_methods_handle->subscribe_state == SUBSCRIBE_STATE_SUBSCRIBED) {
    messagereceiver_destroy(iothubtransport_amqp_methods_handle->message_receiver);
    iothubtransport_amqp_methods_handle->message_receiver = (MESSAGE_RECEIVER_HANDLE)0x0;
    messagesender_destroy(iothubtransport_amqp_methods_handle->message_sender);
    iothubtransport_amqp_methods_handle->message_sender = (MESSAGE_SENDER_HANDLE)0x0;
    link_destroy(iothubtransport_amqp_methods_handle->sender_link);
    iothubtransport_amqp_methods_handle->sender_link = (LINK_HANDLE)0x0;
    link_destroy(iothubtransport_amqp_methods_handle->receiver_link);
    iothubtransport_amqp_methods_handle->receiver_link = (LINK_HANDLE)0x0;
    iothubtransport_amqp_methods_handle->subscribe_state = SUBSCRIBE_STATE_NOT_SUBSCRIBED;
  }
  else {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar2 = "unsubscribe called while not subscribed";
      iVar1 = 0x308;
      goto LAB_0013d6eb;
    }
  }
  return;
}

Assistant:

void iothubtransportamqp_methods_unsubscribe(IOTHUBTRANSPORT_AMQP_METHODS_HANDLE iothubtransport_amqp_methods_handle)
{
    if (iothubtransport_amqp_methods_handle == NULL)
    {
        LogError("NULL handle");
    }
    else
    {
        if (iothubtransport_amqp_methods_handle->subscribe_state != SUBSCRIBE_STATE_SUBSCRIBED)
        {
            LogError("unsubscribe called while not subscribed");
        }
        else
        {
            messagereceiver_destroy(iothubtransport_amqp_methods_handle->message_receiver);
            iothubtransport_amqp_methods_handle->message_receiver = NULL;
            messagesender_destroy(iothubtransport_amqp_methods_handle->message_sender);
            iothubtransport_amqp_methods_handle->message_sender = NULL;
            link_destroy(iothubtransport_amqp_methods_handle->sender_link);
            iothubtransport_amqp_methods_handle->sender_link = NULL;
            link_destroy(iothubtransport_amqp_methods_handle->receiver_link);
            iothubtransport_amqp_methods_handle->receiver_link = NULL;

            iothubtransport_amqp_methods_handle->subscribe_state = SUBSCRIBE_STATE_NOT_SUBSCRIBED;
        }
    }
}